

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

MatchFlags __thiscall QComboBoxPrivate::matchFlags(QComboBoxPrivate *this)

{
  CaseSensitivity CVar1;
  QCompleter *pQVar2;
  QLineEdit *in_RDI;
  long in_FS_OFFSET;
  MatchFlags flags;
  MatchFlag in_stack_ffffffffffffffdc;
  QFlagsStorage<Qt::MatchFlag> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c.i = 0xaaaaaaaa;
  QFlags<Qt::MatchFlag>::QFlags((QFlags<Qt::MatchFlag> *)in_RDI,in_stack_ffffffffffffffdc);
  pQVar2 = QLineEdit::completer(in_RDI);
  if (pQVar2 != (QCompleter *)0x0) {
    QLineEdit::completer(in_RDI);
    CVar1 = QCompleter::caseSensitivity((QCompleter *)in_RDI);
    if (CVar1 != CaseSensitive) goto LAB_00530952;
  }
  QFlags<Qt::MatchFlag>::operator|=((QFlags<Qt::MatchFlag> *)&local_c,MatchCaseSensitive);
LAB_00530952:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QFlagsStorageHelper<Qt::MatchFlag,_4>)(QFlagsStorageHelper<Qt::MatchFlag,_4>)local_c.i;
  }
  __stack_chk_fail();
}

Assistant:

Qt::MatchFlags QComboBoxPrivate::matchFlags() const
{
    // Base how duplicates are determined on the autocompletion case sensitivity
    Qt::MatchFlags flags = Qt::MatchFixedString;
#if QT_CONFIG(completer)
    if (!lineEdit->completer() || lineEdit->completer()->caseSensitivity() == Qt::CaseSensitive)
#endif
        flags |= Qt::MatchCaseSensitive;
    return flags;
}